

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerResults.cpp
# Opt level: O0

void __thiscall
OneWireAnalyzerResults::GenerateFrameTabularText
          (OneWireAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char local_d8 [8];
  char number_str [128];
  bool warning_flag;
  Frame local_48 [8];
  Frame frame;
  ulonglong local_38;
  undefined1 local_28;
  byte local_27;
  DisplayBase display_base_local;
  U64 frame_index_local;
  OneWireAnalyzerResults *this_local;
  
  AnalyzerResults::GetFrame((ulonglong)local_48);
  AnalyzerResults::ClearTabularText();
  number_str[0x7b] = (local_27 & 0x40) != 0;
  AnalyzerHelpers::GetNumberString(local_38,display_base,8,local_d8,0x80);
  switch(local_28) {
  case 0:
    if ((number_str[0x7b] & 1U) == 0) {
      AnalyzerResults::AddTabularText
                ((char *)this,"RESET condition",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddTabularText
                ((char *)this,"RESET - warning, pulse shorter than 480us",(char *)0x0,(char *)0x0,
                 (char *)0x0,(char *)0x0);
    }
    break;
  case 1:
    AnalyzerResults::AddTabularText
              ((char *)this,"PRESENCE condition",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    AnalyzerResults::AddTabularText
              ((char *)this,"READ ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddTabularText
              ((char *)this,"SKIP ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 4:
    AnalyzerResults::AddTabularText
              ((char *)this,"SEARCH ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 5:
    AnalyzerResults::AddTabularText
              ((char *)this,"MATCH ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 6:
    AnalyzerResults::AddTabularText
              ((char *)this,"OVERDRIVE SKIP ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 7:
    AnalyzerResults::AddTabularText
              ((char *)this,"OVERDRIVE MATCH ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 8:
    AnalyzerResults::AddTabularText
              ((char *)this,"CRC section from ROM: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 9:
    AnalyzerResults::AddTabularText
              ((char *)this,"FAMILY CODE section from ROM: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_38,display_base,0x30,local_d8,0x80);
    AnalyzerResults::AddTabularText
              ((char *)this,"ROM CODE section from ROM: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xb:
    AnalyzerResults::AddTabularText((char *)this,"DATA: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xc:
    AnalyzerResults::AddTabularText
              ((char *)this,"BIT - ERROR.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 0xd:
    AnalyzerResults::AddTabularText
              ((char *)this,"Invalid ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xe:
    AnalyzerResults::AddTabularText
              ((char *)this,"ALARM SEARCH ROM command: [",local_d8,"]",(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_48);
  return;
}

Assistant:

void OneWireAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    Frame frame = GetFrame( frame_index );
    ClearTabularText();

    bool warning_flag = false;
    if( ( frame.mFlags & DISPLAY_AS_WARNING_FLAG ) != 0 )
        warning_flag = true;


    // RestartPulse, PresencePulse, ReadRomFrame, SkipRomFrame, SearchRomFrame,  AlarmSearchFrame, MatchRomFrame, OverdriveSkipRomFrame,
    // OverdriveMatchRomFrame, CRC, FamilyCode, Rom, Byte, Bit
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    switch( ( OneWireFrameType )frame.mType )
    {
    case RestartPulse:
    {
        if( warning_flag == false )
        {
            AddTabularText( "RESET condition" );
        }
        else
        {
            AddTabularText( "RESET - warning, pulse shorter than 480us" );
        }
    }
    break;
    case PresencePulse:
    {
        AddTabularText( "PRESENCE condition" );
    }
    break;
    case ReadRomFrame:
    {
        AddTabularText( "READ ROM command: [", number_str, "]" );
    }
    break;
    case SkipRomFrame:
    {
        AddTabularText( "SKIP ROM command: [", number_str, "]" );
    }
    break;
    case SearchRomFrame:
    {
        AddTabularText( "SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case AlarmSearchFrame:
    {
        AddTabularText( "ALARM SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case MatchRomFrame:
    {
        AddTabularText( "MATCH ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveSkipRomFrame:
    {
        AddTabularText( "OVERDRIVE SKIP ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveMatchRomFrame:
    {
        AddTabularText( "OVERDRIVE MATCH ROM command: [", number_str, "]" );
    }
    break;
    case CRC:
    {
        AddTabularText( "CRC section from ROM: [", number_str, "]" );
    }
    break;
    case FamilyCode:
    {
        AddTabularText( "FAMILY CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Rom:
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 48, number_str, 128 );
        AddTabularText( "ROM CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Byte:
    {
        AddTabularText( "DATA: [", number_str, "]" );
    }
    break;
    case Bit:
    {
        AddTabularText( "BIT - ERROR." );
    }
    break;
    case InvalidRomCommandFrame:
    {
        AddTabularText( "Invalid ROM command: [", number_str, "]" );
    }
    break;
    }
}